

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cpp
# Opt level: O0

GlobRank slang::svGlobInternal
                   (path *basePath,string_view pattern,GlobMode mode,
                   SmallVector<std::filesystem::__cxx11::path,_2UL> *results,bool *anyWildcards)

{
  char cVar1;
  string_view pattern_00;
  string_view pattern_01;
  bool bVar2;
  char *pcVar3;
  flat_hash_set<std::string> *pfVar4;
  iterator ppVar5;
  size_type sVar6;
  const_reference pvVar7;
  int in_ECX;
  size_t in_RDI;
  undefined8 in_R8;
  SmallVector<std::filesystem::__cxx11::path,_2UL> *in_R9;
  basic_string_view<char,_std::char_traits<char>_> bVar8;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  error_code ec_1;
  error_code ec;
  path *dir_1;
  iterator __end5;
  iterator __begin5;
  SmallVector<std::filesystem::__cxx11::path,_2UL> *__range5;
  GlobRank rank_1;
  SmallVector<std::filesystem::__cxx11::path,_2UL> dirs_1;
  basic_string_view<char,_std::char_traits<char>_> subPattern;
  char c;
  size_t i;
  bool foundDir;
  bool hasWildcards;
  path *dir;
  iterator __end3;
  iterator __begin3;
  SmallVector<std::filesystem::__cxx11::path,_2UL> *__range3;
  GlobRank rank;
  flat_hash_set<std::string> visited;
  SmallVector<std::filesystem::__cxx11::path,_2UL> dirs;
  string_view originalPattern;
  path currPath;
  error_code *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  GlobRank in_stack_fffffffffffffd14;
  SmallVectorBase<std::filesystem::__cxx11::path> *in_stack_fffffffffffffd18;
  path *in_stack_fffffffffffffd20;
  size_t in_stack_fffffffffffffd28;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  flat_hash_set<std::string> *in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  GlobMode in_stack_fffffffffffffd84;
  SmallVector<std::filesystem::__cxx11::path,_2UL> *in_stack_fffffffffffffd88;
  path *in_stack_fffffffffffffd90;
  iterator local_240;
  GlobRank local_22c;
  GlobMode in_stack_fffffffffffffe14;
  SmallVector<std::filesystem::__cxx11::path,_2UL> *in_stack_fffffffffffffe18;
  path *in_stack_fffffffffffffe20;
  string_view in_stack_fffffffffffffe28;
  flat_hash_set<std::string> *in_stack_fffffffffffffe78;
  undefined2 in_stack_fffffffffffffe80;
  byte in_stack_fffffffffffffe82;
  byte in_stack_fffffffffffffe83;
  undefined4 in_stack_fffffffffffffe84;
  path *in_stack_fffffffffffffe88;
  iterator local_150;
  GlobRank local_13c;
  SmallVectorBase<std::filesystem::__cxx11::path> local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> local_70 [3];
  bool *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd8;
  GlobRank local_4;
  
  std::filesystem::__cxx11::path::path(in_stack_fffffffffffffd20,(path *)in_stack_fffffffffffffd18);
  bVar9._M_str = (char *)in_stack_fffffffffffffd20;
  bVar9._M_len = in_stack_fffffffffffffd28;
  do {
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe8)
    ;
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      if (in_ECX == 0) {
        iterDirectory(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd84)
        ;
        local_4 = Directory;
      }
      else {
        std::error_code::error_code
                  ((error_code *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
        bVar2 = std::filesystem::is_directory
                          ((path *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                           in_stack_fffffffffffffd08);
        if (bVar2) {
          SmallVectorBase<std::filesystem::__cxx11::path>::
          emplace_back<std::filesystem::__cxx11::path>
                    (in_stack_fffffffffffffd18,
                     (path *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
        }
        bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(local_70);
        if ((bVar2) ||
           ((sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size(local_70),
            sVar6 == 1 &&
            (pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](local_70,0),
            *pvVar7 == '/')))) {
          local_4 = Directory;
        }
        else {
          local_4 = SimpleName;
        }
      }
      goto LAB_002d94d8;
    }
    local_80 = sv((char *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                  (size_t)in_stack_fffffffffffffd08);
    bVar8._M_str._0_4_ = in_stack_fffffffffffffd50;
    bVar8._M_len = (size_t)in_stack_fffffffffffffd48;
    bVar8._M_str._4_4_ = in_stack_fffffffffffffd54;
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),bVar8);
    if (bVar2) {
      SmallVector<std::filesystem::__cxx11::path,_2UL>::SmallVector
                ((SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x2d8d87);
      boost::unordered::
      unordered_flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::unordered_flat_set
                ((unordered_flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffd30);
      iterDirectoriesRecursive
                (in_stack_fffffffffffffe88,
                 (SmallVector<std::filesystem::__cxx11::path,_2UL> *)
                 CONCAT44(in_stack_fffffffffffffe84,
                          CONCAT13(in_stack_fffffffffffffe83,
                                   CONCAT12(in_stack_fffffffffffffe82,in_stack_fffffffffffffe80))),
                 in_stack_fffffffffffffe78);
      SmallVectorBase<std::filesystem::__cxx11::path>::emplace_back<std::filesystem::__cxx11::path>
                (in_stack_fffffffffffffd18,
                 (path *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
      bVar9 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (in_stack_fffffffffffffd30,bVar9._M_len,(size_type)bVar9._M_str);
      pcVar3 = (char *)bVar9._M_len;
      local_13c = Directory;
      local_150 = SmallVectorBase<std::filesystem::__cxx11::path>::begin(&local_e8);
      ppVar5 = SmallVectorBase<std::filesystem::__cxx11::path>::end(&local_e8);
      for (; local_150 != ppVar5; local_150 = local_150 + 1) {
        pattern_00._M_str = pcVar3;
        pattern_00._M_len = in_RDI;
        local_13c = svGlobInternal((path *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),pattern_00,
                                   (GlobMode)((ulong)in_R8 >> 0x20),in_R9,in_stack_ffffffffffffffc0)
        ;
      }
      *(undefined1 *)&(in_R9->super_SmallVectorBase<std::filesystem::__cxx11::path>).data_ = 1;
      local_4 = local_13c;
      boost::unordered::
      unordered_flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unordered_flat_set
                ((unordered_flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x2d8f6e);
      SmallVector<std::filesystem::__cxx11::path,_2UL>::~SmallVector
                ((SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x2d8f7b);
      goto LAB_002d94d8;
    }
    in_stack_fffffffffffffe83 = false;
    in_stack_fffffffffffffe82 = 0;
    in_stack_fffffffffffffd48 = (flat_hash_set<std::string> *)0x0;
    while (in_stack_fffffffffffffe78 = in_stack_fffffffffffffd48,
          pfVar4 = (flat_hash_set<std::string> *)
                   std::basic_string_view<char,_std::char_traits<char>_>::size
                             ((basic_string_view<char,_std::char_traits<char>_> *)
                              &stack0xffffffffffffffe8), in_stack_fffffffffffffd48 < pfVar4) {
      pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          &stack0xffffffffffffffe8,(size_type)in_stack_fffffffffffffe78);
      cVar1 = *pvVar7;
      in_stack_fffffffffffffd47 = cVar1 == '?' || cVar1 == '*';
      in_stack_fffffffffffffe83 =
           (in_stack_fffffffffffffe83 & 1) != 0 || (bool)in_stack_fffffffffffffd47;
      if (cVar1 == '/') {
        bVar8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (in_stack_fffffffffffffd30,bVar9._M_len,(size_type)bVar9._M_str);
        in_stack_fffffffffffffd30 = (basic_string_view<char,_std::char_traits<char>_> *)bVar8._M_str
        ;
        bVar9 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (in_stack_fffffffffffffd30,bVar9._M_len,(size_type)bVar9._M_str);
        pcVar3 = (char *)bVar9._M_len;
        if ((in_stack_fffffffffffffe83 & 1) != 0) {
          SmallVector<std::filesystem::__cxx11::path,_2UL>::SmallVector
                    ((SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x2d9117);
          globDir(in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,in_stack_fffffffffffffe18,
                  in_stack_fffffffffffffe14);
          local_22c = Directory;
          local_240 = SmallVectorBase<std::filesystem::__cxx11::path>::begin
                                ((SmallVectorBase<std::filesystem::__cxx11::path> *)
                                 &stack0xfffffffffffffde8);
          ppVar5 = SmallVectorBase<std::filesystem::__cxx11::path>::end
                             ((SmallVectorBase<std::filesystem::__cxx11::path> *)
                              &stack0xfffffffffffffde8);
          for (; local_240 != ppVar5; local_240 = local_240 + 1) {
            pattern_01._M_str = pcVar3;
            pattern_01._M_len = in_RDI;
            in_stack_fffffffffffffd14 =
                 svGlobInternal((path *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),pattern_01,
                                (GlobMode)((ulong)in_R8 >> 0x20),in_R9,in_stack_ffffffffffffffc0);
            local_22c = in_stack_fffffffffffffd14;
          }
          *(undefined1 *)&(in_R9->super_SmallVectorBase<std::filesystem::__cxx11::path>).data_ = 1;
          local_4 = local_22c;
          SmallVector<std::filesystem::__cxx11::path,_2UL>::~SmallVector
                    ((SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x2d929a);
          goto LAB_002d94d8;
        }
        in_stack_fffffffffffffe82 = 1;
        std::filesystem::__cxx11::path::operator/=
                  ((path *)bVar9._M_str,
                   (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd18);
        break;
      }
      in_stack_fffffffffffffd48 =
           (flat_hash_set<std::string> *)
           ((long)&(in_stack_fffffffffffffe78->table_).
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::__cxx11::basic_string<char>_>_>
                   .arrays.groups_size_index + 1);
    }
  } while ((in_stack_fffffffffffffe82 & 1) != 0);
  if ((in_stack_fffffffffffffe83 & 1) == 0) {
    std::error_code::error_code
              ((error_code *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    std::filesystem::__cxx11::path::operator/=
              ((path *)bVar9._M_str,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd18);
    if (((in_ECX == 0) &&
        (bVar2 = std::filesystem::is_regular_file
                           ((path *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                            in_stack_fffffffffffffd08), bVar2)) ||
       ((in_ECX == 1 &&
        (bVar2 = std::filesystem::is_directory
                           ((path *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                            in_stack_fffffffffffffd08), bVar2)))) {
      SmallVectorBase<std::filesystem::__cxx11::path>::emplace_back<std::filesystem::__cxx11::path>
                (in_stack_fffffffffffffd18,
                 (path *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    }
    local_4 = SimpleName;
  }
  else {
    globDir(in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,in_stack_fffffffffffffe18,
            in_stack_fffffffffffffe14);
    *(undefined1 *)&(in_R9->super_SmallVectorBase<std::filesystem::__cxx11::path>).data_ = 1;
    local_4 = WildcardName;
  }
LAB_002d94d8:
  std::filesystem::__cxx11::path::~path
            ((path *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  return local_4;
}

Assistant:

GlobRank svGlobInternal(const fs::path& basePath, std::string_view pattern, GlobMode mode,
                        SmallVector<fs::path>& results, bool& anyWildcards) {
    // Parse the pattern. Consume directories in chunks until
    // we find one that has wildcards for us to handle.
    auto currPath = basePath;
    const auto originalPattern = pattern;
    while (!pattern.empty()) {
        // The '...' pattern only applies at the start of a segment,
        // and means to recursively pull all directories.
        if (pattern.starts_with("..."sv)) {
            SmallVector<fs::path> dirs;
            flat_hash_set<std::string> visited;
            iterDirectoriesRecursive(currPath, dirs, visited);
            dirs.emplace_back(std::move(currPath));

            pattern = pattern.substr(3);

            auto rank = GlobRank::Directory;
            for (auto& dir : dirs)
                rank = svGlobInternal(dir, pattern, mode, results, anyWildcards);

            anyWildcards = true;
            return rank;
        }

        bool hasWildcards = false;
        bool foundDir = false;
        for (size_t i = 0; i < pattern.size(); i++) {
            char c = pattern[i];
            hasWildcards |= (c == '?' || c == '*');
            if (c == fs::path::preferred_separator) {
                auto subPattern = pattern.substr(0, i);
                pattern = pattern.substr(i + 1);

                // If this directory entry had wildcards we need to expand them
                // and recursively search within each expanded directory.
                if (hasWildcards) {
                    SmallVector<fs::path> dirs;
                    globDir(currPath, subPattern, dirs, GlobMode::Directories);

                    auto rank = GlobRank::Directory;
                    for (auto& dir : dirs)
                        rank = svGlobInternal(dir, pattern, mode, results, anyWildcards);

                    anyWildcards = true;
                    return rank;
                }

                // Otherwise just record this directory and move on to the next.
                foundDir = true;
                currPath /= subPattern;
                break;
            }
        }

        // We didn't find a directory separator, so we're going to consume
        // the remainder of the pattern and search for files/directories with
        // that pattern.
        if (!foundDir) {
            if (hasWildcards) {
                globDir(currPath, pattern, results, mode);
                anyWildcards = true;
                return GlobRank::WildcardName;
            }

            // Check for an exact match and add the target if we find it.
            std::error_code ec;
            currPath /= pattern;

            if ((mode == GlobMode::Files && fs::is_regular_file(currPath, ec)) ||
                (mode == GlobMode::Directories && fs::is_directory(currPath, ec))) {
                results.emplace_back(std::move(currPath));
            }

            return GlobRank::SimpleName;
        }
    }

    // If we reach this point, we either had an empty pattern to
    // begin with or we consumed the whole pattern and it had a trailing
    // directory separator. If we are searching for files we want to include
    // all files underneath the directory pointed to by currPath, and if
    // we're searching for directories we'll just take this directory.
    if (mode == GlobMode::Files) {
        iterDirectory(currPath, results, GlobMode::Files);
        return GlobRank::Directory;
    }
    else {
        std::error_code ec;
        if (fs::is_directory(currPath, ec))
            results.emplace_back(std::move(currPath));

        if (originalPattern.empty() ||
            (originalPattern.size() == 1 && originalPattern[0] == fs::path::preferred_separator)) {
            return GlobRank::Directory;
        }
        else {
            return GlobRank::SimpleName;
        }
    }
}